

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O3

void * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::AddString(RepeatedPtrFieldBase *this)

{
  Arena *arena;
  bool bVar1;
  int __old_val;
  int iVar2;
  void **ppvVar3;
  void *pvVar4;
  Rep *pRVar5;
  int iVar6;
  
  pvVar4 = this->tagged_rep_or_elem_;
  arena = this->arena_;
  if (pvVar4 == (void *)0x0) {
    this->current_size_ = 1;
    pvVar4 = NewStringElement(arena);
    this->tagged_rep_or_elem_ = pvVar4;
  }
  else if (((ulong)pvVar4 & 1) == 0) {
    if (this->current_size_ == 0) {
      this->current_size_ = 1;
    }
    else {
      ppvVar3 = InternalExtend(this,1);
      pvVar4 = NewStringElement(arena);
      *ppvVar3 = pvVar4;
      pRVar5 = rep(this);
      pRVar5->allocated_size = 2;
      this->current_size_ = 2;
      pvVar4 = *ppvVar3;
    }
  }
  else {
    pRVar5 = rep(this);
    bVar1 = SizeAtCapacity(this);
    if (bVar1) {
      InternalExtend(this,1);
      pRVar5 = rep(this);
      iVar2 = this->current_size_;
      iVar6 = pRVar5->allocated_size;
    }
    else {
      iVar2 = this->current_size_;
      iVar6 = iVar2;
      if (iVar2 != pRVar5->allocated_size) {
        this->current_size_ = iVar2 + 1;
        return pRVar5->elements[iVar2];
      }
    }
    pRVar5->allocated_size = iVar6 + 1;
    this->current_size_ = iVar2 + 1;
    pvVar4 = NewStringElement(arena);
    pRVar5->elements[iVar2] = pvVar4;
  }
  return pvVar4;
}

Assistant:

void* RepeatedPtrFieldBase::AddString() {
  return AddInternal([](Arena* arena) { return NewStringElement(arena); });
}